

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RunParser(Parse *pParse,char *zSql,char **pzErrMsg)

{
  sqlite3 *db_00;
  undefined8 *p_00;
  Table *pTable;
  char *pcVar1;
  Token yyminor;
  Table *p_1;
  AutoincInfo *p;
  yyParser sEngine;
  int mxSqlLen;
  sqlite3 *db;
  int local_38;
  int lastTokenParsed;
  int tokenType;
  int n;
  void *pEngine;
  char **ppcStack_20;
  int nErr;
  char **pzErrMsg_local;
  char *zSql_local;
  Parse *pParse_local;
  
  pEngine._4_4_ = 0;
  lastTokenParsed = 0;
  db._4_4_ = -1;
  db_00 = pParse->db;
  sEngine.yystackEnd._4_4_ = db_00->aLimit[1];
  if (db_00->nVdbeActive == 0) {
    (db_00->u1).isInterrupted = 0;
  }
  pParse->rc = 0;
  pParse->zTail = zSql;
  _tokenType = &p;
  ppcStack_20 = pzErrMsg;
  pzErrMsg_local = (char **)zSql;
  zSql_local = (char *)pParse;
  sqlite3ParserInit(_tokenType);
LAB_0012c21a:
  do {
    if (*(char *)pzErrMsg_local == '\0') {
      if (db._4_4_ == 1) {
        local_38 = 0;
      }
      else {
        if (db._4_4_ == 0) goto LAB_0012c368;
        local_38 = 1;
      }
      pzErrMsg_local = (char **)((long)pzErrMsg_local - (long)lastTokenParsed);
    }
    else {
      lastTokenParsed = sqlite3GetToken((uchar *)pzErrMsg_local,&local_38);
      sEngine.yystackEnd._4_4_ = sEngine.yystackEnd._4_4_ - lastTokenParsed;
      if (sEngine.yystackEnd._4_4_ < 0) {
        zSql_local[0x18] = '\x12';
        zSql_local[0x19] = '\0';
        zSql_local[0x1a] = '\0';
        zSql_local[0x1b] = '\0';
LAB_0012c368:
        *(char ***)(zSql_local + 0x1f8) = pzErrMsg_local;
        sqlite3ParserFinalize(_tokenType);
        if (db_00->mallocFailed != '\0') {
          zSql_local[0x18] = '\a';
          zSql_local[0x19] = '\0';
          zSql_local[0x1a] = '\0';
          zSql_local[0x1b] = '\0';
        }
        if (((*(int *)(zSql_local + 0x18) != 0) && (*(int *)(zSql_local + 0x18) != 0x65)) &&
           (*(long *)(zSql_local + 8) == 0)) {
          pcVar1 = sqlite3ErrStr(*(int *)(zSql_local + 0x18));
          pcVar1 = sqlite3MPrintf(db_00,"%s",pcVar1);
          *(char **)(zSql_local + 8) = pcVar1;
        }
        if (*(long *)(zSql_local + 8) != 0) {
          *ppcStack_20 = *(char **)(zSql_local + 8);
          sqlite3_log(*(int *)(zSql_local + 0x18),"%s",*ppcStack_20);
          zSql_local[8] = '\0';
          zSql_local[9] = '\0';
          zSql_local[10] = '\0';
          zSql_local[0xb] = '\0';
          zSql_local[0xc] = '\0';
          zSql_local[0xd] = '\0';
          zSql_local[0xe] = '\0';
          zSql_local[0xf] = '\0';
          pEngine._4_4_ = pEngine._4_4_ + 1;
        }
        if (((*(long *)(zSql_local + 0x10) != 0) && (0 < *(int *)(zSql_local + 0x30))) &&
           (zSql_local[0x1e] == '\0')) {
          sqlite3VdbeDelete(*(Vdbe **)(zSql_local + 0x10));
          zSql_local[0x10] = '\0';
          zSql_local[0x11] = '\0';
          zSql_local[0x12] = '\0';
          zSql_local[0x13] = '\0';
          zSql_local[0x14] = '\0';
          zSql_local[0x15] = '\0';
          zSql_local[0x16] = '\0';
          zSql_local[0x17] = '\0';
        }
        if (zSql_local[0x1e] == '\0') {
          sqlite3DbFree(db_00,*(void **)(zSql_local + 0x90));
          zSql_local[0x90] = '\0';
          zSql_local[0x91] = '\0';
          zSql_local[0x92] = '\0';
          zSql_local[0x93] = '\0';
          zSql_local[0x94] = '\0';
          zSql_local[0x95] = '\0';
          zSql_local[0x96] = '\0';
          zSql_local[0x97] = '\0';
          zSql_local[0x8c] = '\0';
          zSql_local[0x8d] = '\0';
          zSql_local[0x8e] = '\0';
          zSql_local[0x8f] = '\0';
        }
        sqlite3_free(*(void **)(zSql_local + 0x228));
        if (zSql_local[0x1d4] == '\0') {
          sqlite3DeleteTable(db_00,*(Table **)(zSql_local + 0x200));
        }
        if (*(long *)(zSql_local + 0x248) != 0) {
          sqlite3WithDelete(db_00,*(With **)(zSql_local + 0x248));
        }
        sqlite3DeleteTrigger(db_00,*(Trigger **)(zSql_local + 0x208));
        sqlite3DbFree(db_00,*(void **)(zSql_local + 0x1e8));
        while (*(long *)(zSql_local + 0x98) != 0) {
          p_00 = *(undefined8 **)(zSql_local + 0x98);
          *(undefined8 *)(zSql_local + 0x98) = *p_00;
          sqlite3DbFreeNN(db_00,p_00);
        }
        while (*(long *)(zSql_local + 0x230) != 0) {
          pTable = *(Table **)(zSql_local + 0x230);
          *(Table **)(zSql_local + 0x230) = pTable->pNextZombie;
          sqlite3DeleteTable(db_00,pTable);
        }
        return pEngine._4_4_;
      }
    }
    if (0xa2 < local_38) {
      if ((db_00->u1).isInterrupted != 0) {
        zSql_local[0x18] = '\t';
        zSql_local[0x19] = '\0';
        zSql_local[0x1a] = '\0';
        zSql_local[0x1b] = '\0';
        goto LAB_0012c368;
      }
      if (local_38 == 0xa4) {
        sqlite3ErrorMsg((Parse *)zSql_local,"unrecognized token: \"%.*s\"",
                        (ulong)(uint)lastTokenParsed,pzErrMsg_local);
        goto LAB_0012c368;
      }
      pzErrMsg_local = (char **)((long)pzErrMsg_local + (long)lastTokenParsed);
      goto LAB_0012c21a;
    }
    *(char ***)(zSql_local + 0x1c0) = pzErrMsg_local;
    *(int *)(zSql_local + 0x1c8) = lastTokenParsed;
    yyminor._12_4_ = 0;
    yyminor._0_12_ = *(undefined1 (*) [12])(zSql_local + 0x1c0);
    sqlite3Parser(_tokenType,local_38,yyminor,(Parse *)zSql_local);
    db._4_4_ = local_38;
    pzErrMsg_local = (char **)((long)pzErrMsg_local + (long)lastTokenParsed);
    if ((*(int *)(zSql_local + 0x18) != 0) || (db_00->mallocFailed != '\0')) goto LAB_0012c368;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3RunParser(Parse *pParse, const char *zSql, char **pzErrMsg){
  int nErr = 0;                   /* Number of errors encountered */
  void *pEngine;                  /* The LEMON-generated LALR(1) parser */
  int n = 0;                      /* Length of the next token token */
  int tokenType;                  /* type of the next token */
  int lastTokenParsed = -1;       /* type of the previous token */
  sqlite3 *db = pParse->db;       /* The database connection */
  int mxSqlLen;                   /* Max length of an SQL string */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  yyParser sEngine;    /* Space to hold the Lemon-generated Parser object */
#endif

  assert( zSql!=0 );
  mxSqlLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
  if( db->nVdbeActive==0 ){
    db->u1.isInterrupted = 0;
  }
  pParse->rc = SQLITE_OK;
  pParse->zTail = zSql;
  assert( pzErrMsg!=0 );
  /* sqlite3ParserTrace(stdout, "parser: "); */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  pEngine = &sEngine;
  sqlite3ParserInit(pEngine);
#else
  pEngine = sqlite3ParserAlloc(sqlite3Malloc);
  if( pEngine==0 ){
    sqlite3OomFault(db);
    return SQLITE_NOMEM_BKPT;
  }
#endif
  assert( pParse->pNewTable==0 );
  assert( pParse->pNewTrigger==0 );
  assert( pParse->nVar==0 );
  assert( pParse->pVList==0 );
  while( 1 ){
    if( zSql[0]!=0 ){
      n = sqlite3GetToken((u8*)zSql, &tokenType);
      mxSqlLen -= n;
      if( mxSqlLen<0 ){
        pParse->rc = SQLITE_TOOBIG;
        break;
      }
    }else{
      /* Upon reaching the end of input, call the parser two more times
      ** with tokens TK_SEMI and 0, in that order. */
      if( lastTokenParsed==TK_SEMI ){
        tokenType = 0;
      }else if( lastTokenParsed==0 ){
        break;
      }else{
        tokenType = TK_SEMI;
      }
      zSql -= n;
    }
    if( tokenType>=TK_SPACE ){
      assert( tokenType==TK_SPACE || tokenType==TK_ILLEGAL );
      if( db->u1.isInterrupted ){
        pParse->rc = SQLITE_INTERRUPT;
        break;
      }
      if( tokenType==TK_ILLEGAL ){
        sqlite3ErrorMsg(pParse, "unrecognized token: \"%.*s\"", n, zSql);
        break;
      }
      zSql += n;
    }else{
      pParse->sLastToken.z = zSql;
      pParse->sLastToken.n = n;
      sqlite3Parser(pEngine, tokenType, pParse->sLastToken, pParse);
      lastTokenParsed = tokenType;
      zSql += n;
      if( pParse->rc!=SQLITE_OK || db->mallocFailed ) break;
    }
  }
  assert( nErr==0 );
  pParse->zTail = zSql;
#ifdef YYTRACKMAXSTACKDEPTH
  sqlite3_mutex_enter(sqlite3MallocMutex());
  sqlite3StatusHighwater(SQLITE_STATUS_PARSER_STACK,
      sqlite3ParserStackPeak(pEngine)
  );
  sqlite3_mutex_leave(sqlite3MallocMutex());
#endif /* YYDEBUG */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  sqlite3ParserFinalize(pEngine);
#else
  sqlite3ParserFree(pEngine, sqlite3_free);
#endif
  if( db->mallocFailed ){
    pParse->rc = SQLITE_NOMEM_BKPT;
  }
  if( pParse->rc!=SQLITE_OK && pParse->rc!=SQLITE_DONE && pParse->zErrMsg==0 ){
    pParse->zErrMsg = sqlite3MPrintf(db, "%s", sqlite3ErrStr(pParse->rc));
  }
  assert( pzErrMsg!=0 );
  if( pParse->zErrMsg ){
    *pzErrMsg = pParse->zErrMsg;
    sqlite3_log(pParse->rc, "%s", *pzErrMsg);
    pParse->zErrMsg = 0;
    nErr++;
  }
  if( pParse->pVdbe && pParse->nErr>0 && pParse->nested==0 ){
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = 0;
  }
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->nested==0 ){
    sqlite3DbFree(db, pParse->aTableLock);
    pParse->aTableLock = 0;
    pParse->nTableLock = 0;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3_free(pParse->apVtabLock);
#endif

  if( !IN_DECLARE_VTAB ){
    /* If the pParse->declareVtab flag is set, do not delete any table 
    ** structure built up in pParse->pNewTable. The calling code (see vtab.c)
    ** will take responsibility for freeing the Table structure.
    */
    sqlite3DeleteTable(db, pParse->pNewTable);
  }

  if( pParse->pWithToFree ) sqlite3WithDelete(db, pParse->pWithToFree);
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->pVList);
  while( pParse->pAinc ){
    AutoincInfo *p = pParse->pAinc;
    pParse->pAinc = p->pNext;
    sqlite3DbFreeNN(db, p);
  }
  while( pParse->pZombieTab ){
    Table *p = pParse->pZombieTab;
    pParse->pZombieTab = p->pNextZombie;
    sqlite3DeleteTable(db, p);
  }
  assert( nErr==0 || pParse->rc!=SQLITE_OK );
  return nErr;
}